

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O2

int __thiscall UniValue::get_int(UniValue *this)

{
  bool bVar1;
  int *piVar2;
  long lVar3;
  runtime_error *this_00;
  char *local_20;
  
  if (this->typ == VNUM) {
    bVar1 = anon_unknown.dwarf_71492e::ParsePrechecks(&this->val);
    if (bVar1) {
      local_20 = (char *)0x0;
      piVar2 = __errno_location();
      *piVar2 = 0;
      lVar3 = strtol((this->val)._M_dataplus._M_p,&local_20,10);
      if ((((local_20 != (char *)0x0) && (*local_20 == '\0')) && (*piVar2 == 0)) &&
         (lVar3 + 0x80000000U >> 0x20 == 0)) {
        return (int)lVar3;
      }
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON integer out of range");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON value is not an integer as expected");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int UniValue::get_int() const
{
    if (typ != VNUM)
        throw std::runtime_error("JSON value is not an integer as expected");
    int32_t retval;
    if (!ParseInt32(getValStr(), &retval))
        throw std::runtime_error("JSON integer out of range");
    return retval;
}